

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

SetupInfo *
es::init::singleton<SetupInfo,_es::init::early_initializer,_void,_std::ios_base::Init>::
first_time_get_instance(void)

{
  bool bVar1;
  int iVar2;
  logic_error *this;
  ostream *poVar3;
  singletons_meta_data *md;
  lock_guard<es::init::tc_spin_lock> guard;
  Init init_object;
  ostream *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator<char> *__a;
  ostream *in_stack_ffffffffffffff88;
  singletons_meta_data *in_stack_ffffffffffffff90;
  allocator<char> local_59 [33];
  string local_38 [55];
  Init local_1;
  
  std::ios_base::Init::Init(&local_1);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff58);
  if (bVar1) {
    in_stack_ffffffffffffff90 =
         (singletons_meta_data *)
         std::operator<<((ostream *)&std::cerr,"Warning: initializing at clean up phase - ");
    in_stack_ffffffffffffff88 =
         std::operator<<((ostream *)in_stack_ffffffffffffff90,
                         "static T &es::init::singleton<SetupInfo>::first_time_get_instance() [T = SetupInfo, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
                        );
    std::ostream::operator<<(in_stack_ffffffffffffff88,std::endl<char,std::char_traits<char>>);
  }
  if (singleton_meta_data_node._p == (void *)0x0) {
    if ((singleton_meta_data_node._flags & 1) != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      __a = local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,__a);
      std::operator+(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
      std::logic_error::logic_error(this,local_38);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::lock_guard<es::init::tc_spin_lock>::lock_guard
              ((lock_guard<es::init::tc_spin_lock> *)in_stack_ffffffffffffff50,
               (mutex_type *)in_stack_ffffffffffffff48);
    if (singleton_meta_data_node._p == (void *)0x0) {
      if (singleton_meta_data_node._init_count != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Warning: 1 first_time_get_instance: initializing Singleton, more than once: init_count: "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,singleton_meta_data_node._init_count);
        poVar3 = std::operator<<(poVar3," - ");
        md = (singletons_meta_data *)
             std::operator<<(poVar3,
                             "static T &es::init::singleton<SetupInfo>::first_time_get_instance() [T = SetupInfo, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
                            );
        in_stack_ffffffffffffff50 = std::operator<<((ostream *)md," ");
        in_stack_ffffffffffffff48 = operator<<(poVar3,md);
        std::ostream::operator<<(in_stack_ffffffffffffff48,std::endl<char,std::char_traits<char>>);
      }
      singleton_meta_data_node._flags = singleton_meta_data_node._flags | 1;
      if ((singleton<SetupInfo,es::init::early_initializer,void,std::ios_base::Init>::
           first_time_get_instance()::iCounter == '\0') &&
         (iVar2 = __cxa_guard_acquire(&singleton<SetupInfo,es::init::early_initializer,void,std::ios_base::Init>
                                       ::first_time_get_instance()::iCounter), iVar2 != 0)) {
        details_static_instances_counting::InstancesCounterZeroActivated<es::init::ActionOnZero>::
        InstancesCounterZeroActivated
                  ((InstancesCounterZeroActivated<es::init::ActionOnZero> *)0x1029d5);
        __cxa_atexit(details_static_instances_counting::
                     InstancesCounterZeroActivated<es::init::ActionOnZero>::
                     ~InstancesCounterZeroActivated,
                     &singleton<SetupInfo,es::init::early_initializer,void,std::ios_base::Init>::
                      first_time_get_instance()::iCounter,&__dso_handle);
        __cxa_guard_release(&singleton<SetupInfo,es::init::early_initializer,void,std::ios_base::Init>
                             ::first_time_get_instance()::iCounter);
      }
      SetupInfo::SetupInfo((SetupInfo *)in_stack_ffffffffffffff50);
      singleton_meta_data_node._func = active_delete;
      singleton_meta_data_node._p = &_u;
      singleton_meta_data_node._func_name =
           "static T &es::init::singleton<SetupInfo>::first_time_get_instance() [T = SetupInfo, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
      ;
      singleton_meta_data_node._init_count = singleton_meta_data_node._init_count + 1;
      static_obj_stack<es::init::singletons_meta_data>::push(in_stack_ffffffffffffff90);
      singleton_meta_data_node._flags = singleton_meta_data_node._flags & 0xfffffffe;
    }
    std::lock_guard<es::init::tc_spin_lock>::~lock_guard
              ((lock_guard<es::init::tc_spin_lock> *)0x102a68);
  }
  std::atomic<SetupInfo_&(*)()>::operator=
            ((atomic<SetupInfo_&(*)()> *)in_stack_ffffffffffffff50,
             (__pointer_type)in_stack_ffffffffffffff48);
  std::ios_base::Init::~Init(&local_1);
  return (SetupInfo *)&_u;
}

Assistant:

static T& first_time_get_instance()
    {
        InitT init_object{};  // make sure, one can use the std::cout std::cerr streams from Singletons code

        if constexpr (es::init::verbose_singletons)
        {
            std::cerr << "Info: firstTimeGetInstance: initializing Singleton: " << __PRETTY_FUNCTION__ << " "
                      << singleton_meta_data_node << std::endl;
        }

        if (clean_up_phase)
        {
            std::cerr << "Warning: initializing at clean up phase - " << __PRETTY_FUNCTION__ << std::endl;
        }

        if (!singleton_meta_data_node._p)
        {
            if (singleton_meta_data_node._flags & 0x1U)
            {
                throw std::logic_error(std::string{"Error: circular dependency "} + __PRETTY_FUNCTION__);
            }
            std::lock_guard<tc_spin_lock> guard(singleton_meta_data_node._lock);

            if (!singleton_meta_data_node._p)
            {
                if (singleton_meta_data_node._init_count > 0)
                {
                    std::cerr
                        << "Warning: 1 first_time_get_instance: initializing Singleton, more than once: init_count: "
                        << singleton_meta_data_node._init_count << " - " << __PRETTY_FUNCTION__ << " "
                        << singleton_meta_data_node << std::endl;
                }

                singleton_meta_data_node._flags |= 0x1U;
                static details_static_instances_counting::InstancesCounterZeroActivated<ActionOnZero> iCounter{};
                new (&_u._instance) T{};

                if constexpr (es::init::verbose_singletons)
                {
                    if (singleton_meta_data_node._init_count > 0)
                        std::cerr << "Warning: 2 first_time_get_instance: initializing Singleton, more than once: "
                                     "init_count: "
                                  << singleton_meta_data_node._init_count << " - " << __PRETTY_FUNCTION__ << " "
                                  << singleton_meta_data_node << std::endl;
                }

                singleton_meta_data_node._func      = active_delete;
                singleton_meta_data_node._p         = (void*)&_u._instance;
                singleton_meta_data_node._func_name = __PRETTY_FUNCTION__;
                singleton_meta_data_node._init_count++;
                stack::push(&singleton_meta_data_node);
                singleton_meta_data_node._flags &= ~0x1U;
            }
        }
        _get_instance = optimized_get_instance;

        return _u._instance;
    }